

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sct_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  size_t sVar1;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    sVar1 = CBS_len(contents);
    if (sVar1 == 0) {
      *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfffffffb | 4;
      hs_local._7_1_ = true;
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_sct_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->scts_requested = true;
  return true;
}